

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBitvecTest(Bitvec *p,pgno i)

{
  long *plVar1;
  uint in_EDX;
  undefined4 in_register_00000014;
  
  plVar1 = *(long **)(i + (ulong)(in_EDX & (int)p - 1U) * 8);
  while( true ) {
    if (plVar1 == (long *)0x0) {
      return 0;
    }
    if (*plVar1 == CONCAT44(in_register_00000014,in_EDX)) {
      return 1;
    }
    plVar1 = (long *)plVar1[2];
    if (plVar1 == (long *)0x0) {
      return 0;
    }
    if (*plVar1 == CONCAT44(in_register_00000014,in_EDX)) {
      return 1;
    }
    plVar1 = (long *)plVar1[2];
    if (plVar1 == (long *)0x0) {
      return 0;
    }
    if (*plVar1 == CONCAT44(in_register_00000014,in_EDX)) {
      return 1;
    }
    plVar1 = (long *)plVar1[2];
    if (plVar1 == (long *)0x0) {
      return 0;
    }
    if (*plVar1 == CONCAT44(in_register_00000014,in_EDX)) break;
    plVar1 = (long *)plVar1[2];
  }
  return 1;
}

Assistant:

UNQLITE_PRIVATE int unqliteBitvecTest(Bitvec *p,pgno i)
{  
	bitvec_rec *pRec;
	/* Point to the desired bucket */
	pRec = p->apRec[i & (p->nSize - 1)];
	for(;;){
		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;

		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;


		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;


		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;
	}
	/* No such entry */
	return 0;
}